

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

Rule * __thiscall pegmatite::Rule::operator=(Rule *this,Rule *r)

{
  std::__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)r);
  return this;
}

Assistant:

Rule& Rule::operator=(Rule &&r)
{
	expr = std::move(r.expr);
	return *this;
}